

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.cc
# Opt level: O0

void __thiscall PersistenceTest::prepare(PersistenceTest *this,uint64_t max)

{
  ulong key;
  int iVar1;
  size_type sVar2;
  uint64_t uVar3;
  ostream *this_00;
  allocator<char> local_341;
  string local_340;
  allocator<char> local_319;
  string local_318;
  string local_2f8;
  allocator<char> local_2d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  int local_2b0;
  allocator<char> local_2a9;
  int l;
  string local_288;
  int local_268;
  allocator<char> local_261;
  int k;
  allocator<char> local_239;
  string local_238;
  string local_218;
  allocator<char> local_1f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  int local_1d0;
  allocator<char> local_1c9;
  int j;
  allocator<char> local_1a1;
  string local_1a0;
  string local_180;
  int local_160;
  allocator<char> local_159;
  int i_1;
  bool local_133;
  bool local_132;
  allocator<char> local_131;
  string local_130;
  string local_110;
  allocator<char> local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  allocator<char> local_c1;
  string local_c0;
  string local_a0;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  allocator<char> local_41;
  string local_40;
  ulong local_20;
  uint64_t i;
  uint64_t max_local;
  PersistenceTest *this_local;
  
  i = max;
  max_local = (uint64_t)this;
  KVStore::reset(&(this->super_Test).store);
  for (local_20 = 0; key = local_20, local_20 < i; local_20 = local_20 + 1) {
    sVar2 = local_20 + 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,sVar2,'s',&local_41);
    KVStore::put(&(this->super_Test).store,key,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    sVar2 = local_20 + 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,sVar2,'s',&local_79);
    KVStore::get_abi_cxx11_(&local_a0,&(this->super_Test).store,local_20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/fourstring[P]sLSMTree/persistence.cc"
               ,&local_c1);
    Test::expect<std::__cxx11::string>(&this->super_Test,&local_78,&local_a0,&local_c0,0x15);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator(&local_c1);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
  }
  Test::phase(&this->super_Test);
  for (local_20 = 0; local_20 < i; local_20 = local_20 + 1) {
    sVar2 = local_20 + 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,sVar2,'s',&local_e9);
    KVStore::get_abi_cxx11_(&local_110,&(this->super_Test).store,local_20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,
               "/workspace/llm4binary/github/license_all_cmakelists_25/fourstring[P]sLSMTree/persistence.cc"
               ,&local_131);
    Test::expect<std::__cxx11::string>(&this->super_Test,&local_e8,&local_110,&local_130,0x1b);
    std::__cxx11::string::~string((string *)&local_130);
    std::allocator<char>::~allocator(&local_131);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator(&local_e9);
  }
  Test::phase(&this->super_Test);
  for (local_20 = 0; local_20 < i; local_20 = local_20 + 2) {
    local_132 = true;
    local_133 = KVStore::del(&(this->super_Test).store,local_20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&i_1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/fourstring[P]sLSMTree/persistence.cc"
               ,&local_159);
    Test::expect<bool>(&this->super_Test,&local_132,&local_133,(string *)&i_1,0x20);
    std::__cxx11::string::~string((string *)&i_1);
    std::allocator<char>::~allocator(&local_159);
  }
  Test::phase(&this->super_Test);
  for (local_160 = 0; (ulong)(long)local_160 < i; local_160 = local_160 + 4) {
    KVStore::get_abi_cxx11_(&local_180,&(this->super_Test).store,(long)local_160);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/fourstring[P]sLSMTree/persistence.cc"
               ,&local_1a1);
    Test::expect<std::__cxx11::string>
              (&this->super_Test,&Test::not_found_abi_cxx11_,&local_180,&local_1a0,0x24);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::allocator<char>::~allocator(&local_1a1);
    std::__cxx11::string::~string((string *)&local_180);
    uVar3 = (uint64_t)local_160;
    iVar1 = local_160 + 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&j,(long)iVar1,'t',&local_1c9);
    KVStore::put(&(this->super_Test).store,uVar3,(string *)&j);
    std::__cxx11::string::~string((string *)&j);
    std::allocator<char>::~allocator(&local_1c9);
  }
  Test::phase(&this->super_Test);
  for (local_1d0 = 1; (ulong)(long)local_1d0 < i; local_1d0 = local_1d0 + 4) {
    iVar1 = local_1d0 + 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f0,(long)iVar1,'s',&local_1f1);
    KVStore::get_abi_cxx11_(&local_218,&(this->super_Test).store,(long)local_1d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,
               "/workspace/llm4binary/github/license_all_cmakelists_25/fourstring[P]sLSMTree/persistence.cc"
               ,&local_239);
    Test::expect<std::__cxx11::string>(&this->super_Test,&local_1f0,&local_218,&local_238,0x29);
    std::__cxx11::string::~string((string *)&local_238);
    std::allocator<char>::~allocator(&local_239);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::allocator<char>::~allocator(&local_1f1);
    uVar3 = (uint64_t)local_1d0;
    iVar1 = local_1d0 + 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&k,(long)iVar1,'t',&local_261);
    KVStore::put(&(this->super_Test).store,uVar3,(string *)&k);
    std::__cxx11::string::~string((string *)&k);
    std::allocator<char>::~allocator(&local_261);
  }
  Test::phase(&this->super_Test);
  for (local_268 = 2; (ulong)(long)local_268 < i; local_268 = local_268 + 4) {
    KVStore::get_abi_cxx11_(&local_288,&(this->super_Test).store,(long)local_268);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&l,
               "/workspace/llm4binary/github/license_all_cmakelists_25/fourstring[P]sLSMTree/persistence.cc"
               ,&local_2a9);
    Test::expect<std::__cxx11::string>
              (&this->super_Test,&Test::not_found_abi_cxx11_,&local_288,(string *)&l,0x2e);
    std::__cxx11::string::~string((string *)&l);
    std::allocator<char>::~allocator(&local_2a9);
    std::__cxx11::string::~string((string *)&local_288);
  }
  Test::phase(&this->super_Test);
  for (local_2b0 = 3; (ulong)(long)local_2b0 < i; local_2b0 = local_2b0 + 4) {
    iVar1 = local_2b0 + 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d0,(long)iVar1,'s',&local_2d1);
    KVStore::get_abi_cxx11_(&local_2f8,&(this->super_Test).store,(long)local_2b0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_318,
               "/workspace/llm4binary/github/license_all_cmakelists_25/fourstring[P]sLSMTree/persistence.cc"
               ,&local_319);
    Test::expect<std::__cxx11::string>(&this->super_Test,&local_2d0,&local_2f8,&local_318,0x32);
    std::__cxx11::string::~string((string *)&local_318);
    std::allocator<char>::~allocator(&local_319);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::allocator<char>::~allocator(&local_2d1);
  }
  Test::phase(&this->super_Test);
  Test::report(&this->super_Test);
  for (local_20 = 0; local_20 < 0x2801; local_20 = local_20 + 1) {
    uVar3 = i + local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_340,0x400,'x',&local_341);
    KVStore::put(&(this->super_Test).store,uVar3,&local_340);
    std::__cxx11::string::~string((string *)&local_340);
    std::allocator<char>::~allocator(&local_341);
  }
  this_00 = std::operator<<((ostream *)&std::cout,
                            "Data is ready, please press ctrl-c/ctrl-d to terminate this program!");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::ostream::flush();
  exit(0);
}

Assistant:

void prepare(uint64_t max) {
        uint64_t i;

        // Clean up
        store.reset();

        // Test multiple key-value pairs
        for (i = 0; i < max; ++i) {
            store.put(i, std::string(i + 1, 's'));
            EXPECT(std::string(i + 1, 's'), store.get(i));
        }
        phase();

        // Test after all insertions
        for (i = 0; i < max; ++i)
            EXPECT(std::string(i + 1, 's'), store.get(i));
        phase();

        // Test deletions
        for (i = 0; i < max; i += 2)
            EXPECT(true, store.del(i));

        phase();
        for (int i = 0; i < max; i += 4) {
            EXPECT(not_found, store.get(i));
            store.put(i, std::string(i + 1, 't'));
        }
        phase();
        for (int j = 1; j < max; j += 4) {
            EXPECT(std::string(j + 1, 's'), store.get(j));
            store.put(j, std::string(j + 1, 't'));
        }
        phase();
        for (int k = 2; k < max; k += 4) {
            EXPECT(not_found, store.get(k));
        }
        phase();
        for (int l = 3; l < max; l += 4) {
            EXPECT(std::string(l + 1, 's'), store.get(l));
        }
        phase();
        // Prepare data for Test Mode
        /*for (i = 0; i < max; ++i) {
            switch (i & 3) {
                case 0:
                    EXPECT(not_found, store.get(i));
                    store.put(i, std::string(i + 1, 't'));
                    break;
                case 1:
                    EXPECT(std::string(i + 1, 's'), store.get(i));
                    store.put(i, std::string(i + 1, 't'));
                    break;
                case 2:
                    EXPECT(not_found, store.get(i));
                    break;
                case 3:
                    EXPECT(std::string(i + 1, 's'), store.get(i));
                    break;
                default:
                    assert(0);
            }
        }*/

        report();

        /**
         * Write 10MB data to drain previous data out of memory.
         */
        for (i = 0; i <= 10240; ++i)
            store.put(max + i, std::string(1024, 'x'));

        std::cout << "Data is ready, please press ctrl-c/ctrl-d to"
                     " terminate this program!" << std::endl;
        std::cout.flush();

        exit(0);
    }